

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_huge(chunk_conflict *c,loc centre,wchar_t rating)

{
  bool bVar1;
  _Bool _Var2;
  uint32_t uVar3;
  wchar_t h;
  wchar_t w;
  wchar_t y1_00;
  wchar_t x1_00;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  wchar_t width;
  wchar_t height;
  wchar_t height_tmp;
  wchar_t width_tmp;
  wchar_t x2_tmp;
  wchar_t y2_tmp;
  wchar_t x1_tmp;
  wchar_t y1_tmp;
  wchar_t x2;
  wchar_t y2;
  wchar_t x1;
  wchar_t y1;
  wchar_t count;
  wchar_t i;
  _Bool light;
  _Bool finding_space;
  wchar_t rating_local;
  chunk_conflict *c_local;
  int iStack_10;
  loc centre_local;
  
  iStack_10 = centre.y;
  bVar1 = true;
  if (iStack_10 < c->height) {
    c_local._4_4_ = centre.x;
    bVar1 = c->width <= c_local._4_4_;
  }
  unique0x10000216 = centre;
  uVar3 = Rand_div(10);
  h = uVar3 + L'\x1e';
  uVar3 = Rand_div(0x32);
  w = uVar3 + L'-';
  if ((int)(uint)!bVar1 < dun->cent_n - dun->nstair_room) {
    centre_local.x._3_1_ = false;
  }
  else {
    uVar3 = Rand_div(0x14);
    if (uVar3 == 0) {
      uVar3 = Rand_div(3);
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,h,w);
      if ((!bVar1) || (_Var2 = find_space((loc *)((long)&c_local + 4),h,w), _Var2)) {
        y1_00 = iStack_10 - h / 2;
        x1_00 = c_local._4_4_ - w / 2;
        _Var2 = generate_starburst_room
                          (c,y1_00,x1_00,y1_00 + h + L'\xffffffff',x1_00 + w + L'\xffffffff',
                           uVar3 != 0,L'\x01',false);
        if (_Var2) {
          uVar3 = Rand_div(5);
          if (2 < (int)(uVar3 + 1)) {
            event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,"rubble");
            uVar3 = Rand_div(2);
            for (y1 = L'\0'; y1 < (h * w * (uVar3 + 1)) / 0x44c; y1 = y1 + L'\x01') {
              uVar4 = Rand_div(0x10);
              uVar5 = Rand_div(0x18);
              uVar6 = Rand_div(h - (uVar4 + 8));
              uVar7 = Rand_div(w - (uVar5 + 10));
              generate_starburst_room
                        (c,y1_00 + uVar6,x1_00 + uVar7,y1_00 + uVar6 + uVar4 + 8,
                         x1_00 + uVar7 + uVar5 + 10,false,L'\x18',false);
            }
          }
          if (((player->opts).opt[0x18] & 1U) != 0) {
            msg("Huge room");
          }
          centre_local.x._3_1_ = true;
        }
        else {
          centre_local.x._3_1_ = false;
        }
      }
      else {
        centre_local.x._3_1_ = false;
      }
    }
    else {
      centre_local.x._3_1_ = false;
    }
  }
  return centre_local.x._3_1_;
}

Assistant:

bool build_huge(struct chunk *c, struct loc centre, int rating)
{
	bool finding_space = centre.y >= c->height || centre.x >= c->width;
	bool light;

	int i, count;

	int y1, x1, y2, x2;
	int y1_tmp, x1_tmp, y2_tmp, x2_tmp;
	int width_tmp, height_tmp;

	int height = 30 + randint0(10);
	int width = 45 + randint0(50);

	/*
	 * Only try to build a huge room as the first non-staircase room.  If
	 * not finding space, cent_n has already been increment.
	 */
	if (dun->cent_n - dun->nstair_room > ((finding_space) ? 0 : 1))
		return false;

	/* Flat 5% chance */
	if (!one_in_(20)) return false;

	/* This room is usually lit. */
	light = !one_in_(3);

	/* Find and reserve some space.  Get center of room. */
	event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE, height, width);
	if (finding_space) {
		if (!find_space(&centre, height, width))
			return (false);
	}

	/* Locate the room */
	y1 = centre.y - height / 2;
	x1 = centre.x - width / 2;
	y2 = y1 + height - 1;
	x2 = x1 + width - 1;

	/* Make a huge starburst room with optional light. */
	if (!generate_starburst_room(c, y1, x1, y2, x2, light, FEAT_FLOOR, false))
		return (false);

	/* Often, add rubble to break things up a bit. */
	if (randint1(5) > 2) {
		event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE, "rubble");

		/* Determine how many rubble fields to add (between 1 and 6). */
		count = height * width * randint1(2) / 1100;

		/* Make the rubble fields. */
		for (i = 0; i < count; i++) {
			height_tmp = 8 + randint0(16);
			width_tmp = 10 + randint0(24);

			/* Semi-random location. */
			y1_tmp = y1 + randint0(height - height_tmp);
			x1_tmp = x1 + randint0(width - width_tmp);
			y2_tmp = y1_tmp + height_tmp;
			x2_tmp = x1_tmp + width_tmp;

			/* Make the rubble field. */
			generate_starburst_room(c, y1_tmp, x1_tmp, y2_tmp, x2_tmp,
									false, FEAT_PASS_RUBBLE, false);
		}
	}

	/* Describe */
	ROOM_LOG("Huge room");

	/* Success. */
	return (true);
}